

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC,int *stage_map,int *nstages_stored)

{
  uint uVar1;
  realtype ***ppprVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  iVar6 = -0x16;
  if ((MRIC != (MRIStepCoupling)0x0) &&
     (((ppprVar2 = MRIC->W, ppprVar2 != (realtype ***)0x0 || (MRIC->G != (realtype ***)0x0)) &&
      (nstages_stored != (int *)0x0 && stage_map != (int *)0x0)))) {
    *nstages_stored = 0;
    iVar5 = 0;
    for (lVar7 = 0; uVar1 = MRIC->stages, lVar7 < (int)uVar1; lVar7 = lVar7 + 1) {
      if (ppprVar2 == (realtype ***)0x0) {
        bVar4 = false;
      }
      else {
        uVar9 = (ulong)(uint)MRIC->nmat;
        if (MRIC->nmat < 1) {
          uVar9 = 0;
        }
        dVar11 = 0.0;
        for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
          for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
            dVar11 = dVar11 + ABS(ppprVar2[uVar10][uVar8][lVar7]);
          }
        }
        bVar4 = 2.220446049250313e-14 < dVar11;
      }
      if (MRIC->G == (realtype ***)0x0) {
        bVar3 = false;
      }
      else {
        uVar9 = (ulong)(uint)MRIC->nmat;
        if (MRIC->nmat < 1) {
          uVar9 = 0;
        }
        dVar11 = 0.0;
        for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
          for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
            dVar11 = dVar11 + ABS(MRIC->G[uVar10][uVar8][lVar7]);
          }
        }
        bVar3 = 2.220446049250313e-14 < dVar11;
      }
      iVar6 = -1;
      if ((bool)(bVar4 | bVar3)) {
        iVar6 = iVar5;
      }
      iVar5 = iVar5 + (uint)(byte)(bVar4 | bVar3);
      stage_map[lVar7] = iVar6;
    }
    iVar6 = -0x16;
    if (iVar5 != 0) {
      *nstages_stored = iVar5;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC,
                                int* stage_map,
                                int* nstages_stored)
{
  int i, j, k, idx;
  realtype Wsum, Gsum;
  const realtype tol = RCONST(100.0) * UNIT_ROUNDOFF;

  /* ----------------------
   * Check for valid inputs
   * ---------------------- */

  if (!MRIC) return(ARK_ILL_INPUT);
  if (!(MRIC->W) && !(MRIC->G)) return(ARK_ILL_INPUT);
  if (!stage_map || !nstages_stored) return(ARK_ILL_INPUT);

  /* -------------------
   * Compute storage map
   * ------------------- */

  /* Number of stage RHS vectors stored */
  *nstages_stored = 0;

  /* Initial storage index */
  idx = 0;

  /* Check if a stage corresponds to a column of zeros for all coupling
   * matrices by computing the column sums */
  for (j = 0; j < MRIC->stages; j++) {

    Wsum = ZERO;
    Gsum = ZERO;

    if (MRIC->W)
      for (k = 0; k < MRIC->nmat; k++)
        for (i = 0; i < MRIC->stages; i++)
          Wsum += SUNRabs(MRIC->W[k][i][j]);

    if (MRIC->G)
      for (k = 0; k < MRIC->nmat; k++)
        for (i = 0; i < MRIC->stages; i++)
          Gsum += SUNRabs(MRIC->G[k][i][j]);

    if (Wsum > tol || Gsum > tol) {
      stage_map[j] = idx;
      idx++;
    } else {
      stage_map[j] = -1;
    }
  }

  /* Check and set number of stage RHS vectors stored */
  if (idx < 1) return(ARK_ILL_INPUT);

  *nstages_stored = idx;

  return(ARK_SUCCESS);
}